

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall cmGeneratorTarget::MacOSXUseInstallNameDir(cmGeneratorTarget *this)

{
  bool bVar1;
  cmGlobalGenerator *this_00;
  string *psVar2;
  allocator<char> local_91;
  string local_90;
  byte local_6d;
  PolicyStatus local_6c;
  undefined1 auStack_68 [3];
  bool use_install_name;
  PolicyStatus cmp0068;
  char *local_60;
  allocator<char> local_41;
  string local_40;
  cmValue local_20;
  cmValue build_with_install_name;
  cmGeneratorTarget *this_local;
  
  build_with_install_name.Value = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"BUILD_WITH_INSTALL_NAME_DIR",&local_41);
  local_20 = GetProperty(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  bVar1 = cmValue::operator_cast_to_bool(&local_20);
  if (bVar1) {
    psVar2 = cmValue::operator*[abi_cxx11_(&local_20);
    _auStack_68 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar2);
    this_local._7_1_ = cmIsOn(_auStack_68);
  }
  else {
    local_6c = GetPolicyStatusCMP0068(this);
    if (local_6c == NEW) {
      this_local._7_1_ = false;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"BUILD_WITH_INSTALL_RPATH",&local_91);
      bVar1 = GetPropertyAsBool(this,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator(&local_91);
      local_6d = bVar1;
      if ((bVar1) && (local_6c == WARN)) {
        this_00 = cmLocalGenerator::GetGlobalGenerator(this->LocalGenerator);
        psVar2 = GetName_abi_cxx11_(this);
        cmGlobalGenerator::AddCMP0068WarnTarget(this_00,psVar2);
      }
      this_local._7_1_ = (bool)(local_6d & 1);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmGeneratorTarget::MacOSXUseInstallNameDir() const
{
  cmValue build_with_install_name =
    this->GetProperty("BUILD_WITH_INSTALL_NAME_DIR");
  if (build_with_install_name) {
    return cmIsOn(*build_with_install_name);
  }

  cmPolicies::PolicyStatus cmp0068 = this->GetPolicyStatusCMP0068();
  if (cmp0068 == cmPolicies::NEW) {
    return false;
  }

  bool use_install_name = this->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH");

  if (use_install_name && cmp0068 == cmPolicies::WARN) {
    this->LocalGenerator->GetGlobalGenerator()->AddCMP0068WarnTarget(
      this->GetName());
  }

  return use_install_name;
}